

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# to_decimal.hpp
# Opt level: O3

bool duckdb::ToCDecimalCastWrapper<short>::Operation<double>
               (double input,duckdb_decimal *result,CastParameters *parameters,uint8_t width,
               uint8_t scale)

{
  bool bVar1;
  hugeint_t hVar2;
  int16_t intermediate_result;
  short local_3a;
  undefined8 local_38;
  uint64_t uStack_30;
  int64_t local_28;
  
  bVar1 = TryCastToDecimal::Operation<double,short>(input,&local_3a,parameters,width,scale);
  if (bVar1) {
    hVar2 = Hugeint::Convert<short>(local_3a);
    result->scale = scale;
    result->width = width;
    (result->value).lower = hVar2.lower;
    (result->value).upper = hVar2.upper;
  }
  else {
    FetchDefaultValue::Operation<duckdb_decimal>();
    (result->value).upper = local_28;
    result->width = (undefined1)local_38;
    result->scale = local_38._1_1_;
    *(undefined6 *)&result->field_0x2 = local_38._2_6_;
    (result->value).lower = uStack_30;
  }
  return bVar1;
}

Assistant:

static bool Operation(SOURCE_TYPE input, duckdb_decimal &result, CastParameters &parameters, uint8_t width,
	                      uint8_t scale) {
		int16_t intermediate_result;

		if (!TryCastToDecimal::Operation<SOURCE_TYPE, int16_t>(input, intermediate_result, parameters, width, scale)) {
			result = FetchDefaultValue::Operation<duckdb_decimal>();
			return false;
		}
		hugeint_t hugeint_result = Hugeint::Convert(intermediate_result);

		result.scale = scale;
		result.width = width;

		duckdb_hugeint hugeint_value;
		hugeint_value.upper = hugeint_result.upper;
		hugeint_value.lower = hugeint_result.lower;
		result.value = hugeint_value;
		return true;
	}